

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O0

int Centaurus::LookaheadDFA<wchar_t>::get_closure_color(CATNClosure *closure)

{
  bool bVar1;
  int iVar2;
  reference this;
  CATNClosureElement *p;
  iterator __end2;
  iterator __begin2;
  CATNClosure *__range2;
  int color;
  CATNClosure *closure_local;
  
  __range2._4_4_ = 0;
  __end2 = std::
           set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
           ::begin(closure);
  p = (CATNClosureElement *)
      std::
      set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
      ::end(closure);
  do {
    bVar1 = std::operator!=(&__end2,(_Self *)&p);
    if (!bVar1) {
      return __range2._4_4_;
    }
    this = std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator*(&__end2);
    if (__range2._4_4_ == 0) {
      __range2._4_4_ = CATNClosureElement::color(this);
    }
    else {
      iVar2 = CATNClosureElement::color(this);
      if ((__range2._4_4_ != iVar2) && (iVar2 = CATNClosureElement::color(this), iVar2 != 0)) {
        return -1;
      }
    }
    std::_Rb_tree_const_iterator<Centaurus::CATNClosureElement>::operator++(&__end2);
  } while( true );
}

Assistant:

static int get_closure_color(const CATNClosure& closure)
	{
		int color = 0;
		for (const auto& p : closure)
		{
			if (color == 0)
			{
				color = p.color();
			}
			else
			{
				if (color != p.color() && p.color() != 0)
					return -1;
			}
		}
		return color;
	}